

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void build_obmc_inter_pred_above
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *above_mi,void *fun_ctxt,int num_planes)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  long lVar4;
  uint8_t *puVar5;
  _func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
  **pp_Var6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  uint length;
  int iVar14;
  
  uVar9 = (ulong)(*xd->mi)->bsize;
  if ((0x2f0bffUL >> (uVar9 & 0x3f) & 1) == 0) {
    uVar10 = 0x20;
  }
  else {
    uVar10 = (uint)(block_size_high[uVar9] >> 1);
  }
  uVar13 = 0;
  uVar8 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar8 = uVar13;
  }
  piVar12 = &xd->plane[0].subsampling_x;
  for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
    bVar7 = (byte)*piVar12;
    length = uVar10 >> ((byte)piVar12[1] & 0x1f);
    if (BLOCK_8X4 < av1_ss_size_lookup[uVar9][*piVar12][piVar12[1]]) {
      uVar1 = piVar12[9];
      lVar11 = (long)((rel_mi_col << 2) >> (bVar7 & 0x1f));
      puVar3 = ((buf_2d *)(piVar12 + 3))->buf;
      uVar2 = *(uint32_t *)(*(long *)((long)fun_ctxt + 8) + uVar13 * 4);
      lVar4 = *(long *)(*fun_ctxt + uVar13 * 8);
      iVar14 = 0x32e2fd;
      puVar5 = av1_get_obmc_mask(length);
      if ((xd->cur_buf->flags & 8) == 0) {
        pp_Var6 = &aom_blend_a64_vmask;
      }
      else {
        iVar14 = xd->bd;
        pp_Var6 = (_func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
                   **)&aom_highbd_blend_a64_vmask;
      }
      (**pp_Var6)(puVar3 + lVar11,uVar1,puVar3 + lVar11,uVar1,(uint8_t *)(lVar11 + lVar4),uVar2,
                  puVar5,((uint)op_mi_size << 2) >> (bVar7 & 0x1f),length,iVar14);
    }
    piVar12 = piVar12 + 0x28c;
  }
  return;
}

Assistant:

static inline void build_obmc_inter_pred_above(
    MACROBLOCKD *xd, int rel_mi_row, int rel_mi_col, uint8_t op_mi_size,
    int dir, MB_MODE_INFO *above_mi, void *fun_ctxt, const int num_planes) {
  (void)above_mi;
  (void)rel_mi_row;
  (void)dir;
  struct obmc_inter_pred_ctxt *ctxt = (struct obmc_inter_pred_ctxt *)fun_ctxt;
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;
  const int overlap =
      AOMMIN(block_size_high[bsize], block_size_high[BLOCK_64X64]) >> 1;

  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    const int bw = (op_mi_size * MI_SIZE) >> pd->subsampling_x;
    const int bh = overlap >> pd->subsampling_y;
    const int plane_col = (rel_mi_col * MI_SIZE) >> pd->subsampling_x;

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, 0)) continue;

    const int dst_stride = pd->dst.stride;
    uint8_t *const dst = &pd->dst.buf[plane_col];
    const int tmp_stride = ctxt->adjacent_stride[plane];
    const uint8_t *const tmp = &ctxt->adjacent[plane][plane_col];
    const uint8_t *const mask = av1_get_obmc_mask(bh);
#if CONFIG_AV1_HIGHBITDEPTH
    const int is_hbd = is_cur_buf_hbd(xd);
    if (is_hbd)
      aom_highbd_blend_a64_vmask(dst, dst_stride, dst, dst_stride, tmp,
                                 tmp_stride, mask, bw, bh, xd->bd);
    else
      aom_blend_a64_vmask(dst, dst_stride, dst, dst_stride, tmp, tmp_stride,
                          mask, bw, bh);
#else
    aom_blend_a64_vmask(dst, dst_stride, dst, dst_stride, tmp, tmp_stride, mask,
                        bw, bh);
#endif
  }
}